

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_l5.c
# Opt level: O0

int picnic3_l5_keygen(picnic3_l5_publickey_t *pk,picnic3_l5_privatekey_t *sk)

{
  int iVar1;
  uint8_t *dst;
  undefined8 *num_bits;
  long in_RSI;
  undefined8 *in_RDI;
  uint8_t *sk_c;
  uint8_t *sk_pt;
  uint8_t *sk_sk;
  picnic3_l5_publickey_t *in_stack_00000058;
  picnic3_l5_privatekey_t *in_stack_00000060;
  int local_4;
  
  if ((in_RDI == (undefined8 *)0x0) || (in_RSI == 0)) {
    local_4 = -1;
  }
  else {
    dst = (uint8_t *)(in_RSI + 0x40);
    num_bits = (undefined8 *)(in_RSI + 0x20);
    iVar1 = rand_bits(dst,(size_t)num_bits);
    if (iVar1 == 0) {
      iVar1 = rand_bits(dst,(size_t)num_bits);
      if (iVar1 == 0) {
        iVar1 = picnic3_l5_sk_to_pk(in_stack_00000060,in_stack_00000058);
        if (iVar1 == 0) {
          *num_bits = *in_RDI;
          num_bits[1] = in_RDI[1];
          num_bits[2] = in_RDI[2];
          num_bits[3] = in_RDI[3];
          local_4 = 0;
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic3_l5_keygen(picnic3_l5_publickey_t* pk,
                                                  picnic3_l5_privatekey_t* sk) {
  if (!pk || !sk) {
    return -1;
  }

  uint8_t* sk_sk = SK_SK(sk);
  uint8_t* sk_pt = SK_PT(sk);
  uint8_t* sk_c  = SK_C(sk);

  // generate private key
  // random secret key
  if (rand_bits(sk_sk, LOWMC_BLOCK_BITS)) {
    return -1;
  }
  // random plain text
  if (rand_bits(sk_pt, LOWMC_BLOCK_BITS)) {
    return -1;
  }
  // encrypt plaintext under secret key
  if (picnic3_l5_sk_to_pk(sk, pk)) {
    return -1;
  }
  // copy ciphertext to secret key
  memcpy(sk_c, PK_C(pk), LOWMC_BLOCK_SZ);
  return 0;
}